

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial.cpp
# Opt level: O0

Integer mathiu::impl::degree(ExprPtr *ex,ExprPtr *varSet)

{
  RetType_conflict7 RVar1;
  ostream *poVar2;
  element_type *peVar3;
  ExprPtr *ex_00;
  ExprPtr *ex_01;
  anon_class_8_1_700bc8f9 *func;
  PatternHelper<matchit::impl::Wildcard> local_4b1;
  anon_class_16_2_edae137c local_4b0;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_polynomial_cpp:64:27)>
  local_4a0;
  Id<mathiu::impl::Sum> local_488;
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  local_440;
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  local_3d8;
  anon_class_16_2_edae1e05 local_370;
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_polynomial_cpp:61:37)>
  local_360;
  ValueT local_2e8;
  undefined1 local_2e0 [8];
  Id<mathiu::impl::Sum> iS;
  __shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_290
  ;
  PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_polynomial_cpp:56:27)>
  local_288;
  Id<mathiu::impl::Set> local_278;
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  local_230;
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>
  local_1c8;
  anon_class_8_1_898cac37 local_160;
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O0__deps_matchit_src_include_matchit_h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_polynomial_cpp:54:39)>
  local_158;
  ValueT local_e8;
  undefined1 local_e0 [8];
  RetType_conflict6 varSet_;
  Id<mathiu::impl::Set> iSet;
  string local_38;
  impl *local_18;
  ExprPtr *varSet_local;
  ExprPtr *ex_local;
  
  local_18 = (impl *)varSet;
  varSet_local = ex;
  poVar2 = std::operator<<((ostream *)&std::cout,"degree: ");
  toString_abi_cxx11_(&local_38,(impl *)varSet_local,ex_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  poVar2 = std::operator<<(poVar2,",\t");
  toString_abi_cxx11_((string *)
                      ((long)&iSet.mBlock.
                              super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                              .
                              super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                      + 0x40),local_18,ex_01);
  poVar2 = std::operator<<(poVar2,(string *)
                                  ((long)&iSet.mBlock.
                                          super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                          .
                                          super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                                  + 0x40));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string
            ((string *)
             ((long)&iSet.mBlock.
                     super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
                     .
                     super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Set>,_matchit::impl::IdBlock<mathiu::impl::Set>_*>
             + 0x40));
  std::__cxx11::string::~string((string *)&local_38);
  matchit::impl::Id<mathiu::impl::Set>::Id
            ((Id<mathiu::impl::Set> *)
             &varSet_.super_ExprPtrSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  peVar3 = std::
           __shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_18);
  local_e8 = (ValueT)matchit::impl::match<mathiu::impl::Expr_const&>(peVar3);
  local_160.iSet =
       (Id<mathiu::impl::Set> *)
       &varSet_.super_ExprPtrSet._M_t._M_impl.super__Rb_tree_header._M_node_count;
  matchit::impl::Id<mathiu::impl::Set>::Id(&local_278,local_160.iSet);
  matchit::impl::as<mathiu::impl::Set>::{lambda(auto:1)#1}::operator()
            (&local_230,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Set>,&local_278);
  matchit::impl::PatternPipable::operator|
            (&local_1c8,(PatternPipable *)&matchit::impl::pattern,&local_230);
  matchit::impl::
  PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>
  ::operator=(&local_158,
              (PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Set>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Set>>>>>
               *)&local_1c8,&local_160);
  local_290 = (__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)local_18;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  local_288.mHandler.varSet =
       (ExprPtr *)
       matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator=
                 ((PatternPair<matchit::impl::Wildcard,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_src_polynomial_cpp:56:27)>
                   *)((long)&iS.mBlock.
                             super__Variant_base<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                             .
                             super__Move_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                             .
                             super__Copy_assign_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                             .
                             super__Move_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                             .
                             super__Copy_ctor_alias<matchit::impl::IdBlock<mathiu::impl::Sum>,_matchit::impl::IdBlock<mathiu::impl::Sum>_*>
                     + 0x47),(PatternHelper<matchit::impl::Wildcard> *)&local_290,func);
  matchit::impl::MatchHelper<mathiu::impl::Expr_const&,true>::operator()
            ((RetType_conflict6 *)local_e0,(MatchHelper<mathiu::impl::Expr_const&,true> *)&local_e8,
             &local_158,&local_288);
  matchit::impl::
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/polynomial.cpp:54:39)>
  ::~PatternPair(&local_158);
  matchit::impl::
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>_>
  ::~PatternHelper(&local_1c8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Set>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Set>_>_>_>
  ::~App(&local_230);
  matchit::impl::Id<mathiu::impl::Set>::~Id(&local_278);
  matchit::impl::Id<mathiu::impl::Sum>::Id((Id<mathiu::impl::Sum> *)local_2e0);
  peVar3 = std::
           __shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)varSet_local);
  local_2e8 = (ValueT)matchit::impl::match<mathiu::impl::Expr_const&>(peVar3);
  local_370.iS = (Id<mathiu::impl::Sum> *)local_2e0;
  local_370.varSet_ = (RetType_conflict6 *)local_e0;
  matchit::impl::Id<mathiu::impl::Sum>::Id(&local_488,local_370.iS);
  matchit::impl::as<mathiu::impl::Sum>::{lambda(auto:1)#1}::operator()
            (&local_440,(_lambda_auto_1__1_ *)&matchit::impl::as<mathiu::impl::Sum>,&local_488);
  matchit::impl::PatternPipable::operator|
            (&local_3d8,(PatternPipable *)&matchit::impl::pattern,&local_440);
  matchit::impl::
  PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::{lambda(auto:1&&)#1}const&,bool>,matchit::impl::App<matchit::impl::$_1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>
  ::operator=(&local_360,
              (PatternHelper<matchit::impl::App<matchit::impl::AsPointer<mathiu::impl::Sum>const&,matchit::impl::And<matchit::impl::App<matchit::impl::cast<bool>::_lambda(auto:1&&)_1_const&,bool>,matchit::impl::App<matchit::impl::__1_const&,matchit::impl::Id<mathiu::impl::Sum>>>>>
               *)&local_3d8,&local_370);
  local_4b0.ex = varSet_local;
  local_4b0.varSet_ = (RetType_conflict6 *)local_e0;
  matchit::impl::PatternPipable::operator|
            ((PatternPipable *)&matchit::impl::pattern,(Wildcard *)&matchit::impl::_);
  matchit::impl::PatternHelper<matchit::impl::Wildcard>::operator=(&local_4a0,&local_4b1,&local_4b0)
  ;
  RVar1 = matchit::impl::MatchHelper<mathiu::impl::Expr_const&,true>::operator()
                    ((MatchHelper<mathiu::impl::Expr_const&,true> *)&local_2e8,&local_360,&local_4a0
                    );
  matchit::impl::
  PatternPair<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/src/polynomial.cpp:61:37)>
  ::~PatternPair(&local_360);
  matchit::impl::
  PatternHelper<matchit::impl::App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>_>
  ::~PatternHelper(&local_3d8);
  matchit::impl::
  App<const_matchit::impl::AsPointer<mathiu::impl::Sum>_&,_matchit::impl::And<matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2062:27)_&,_bool>,_matchit::impl::App<const_matchit::impl::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/build_O0/_deps/matchit-src/include/matchit.h:2065:28)_&,_matchit::impl::Id<mathiu::impl::Sum>_>_>_>
  ::~App(&local_440);
  matchit::impl::Id<mathiu::impl::Sum>::~Id(&local_488);
  matchit::impl::Id<mathiu::impl::Sum>::~Id((Id<mathiu::impl::Sum> *)local_2e0);
  Set::~Set((Set *)local_e0);
  matchit::impl::Id<mathiu::impl::Set>::~Id
            ((Id<mathiu::impl::Set> *)
             &varSet_.super_ExprPtrSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return RVar1;
}

Assistant:

Integer degree(ExprPtr const &ex, ExprPtr const &varSet)
    {
#if DEBUG
        std::cout << "degree: " << toString(ex) << ",\t" << toString(varSet) << std::endl;
#endif // DEBUG

        using namespace matchit;
        Id<Set> iSet;
        auto const varSet_ = match(*varSet)(
            pattern | as<Set>(iSet) = [&]
            { return *iSet; },
            pattern | _ = [&]
            { return Set{{{varSet}}}; });

        Id<Sum> iS;
        return match(*ex)(
            pattern | as<Sum>(iS) = [&]
            { return std::accumulate((*iS).begin(), (*iS).end(), 0, [&](Integer sum, auto &&e)
                                     { return std::max(sum, degreeMonomial(e.second, varSet_)); }); },
            pattern | _ = [&]
            { return degreeMonomial(ex, varSet_); });
    }